

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac.c
# Opt level: O1

ssize_t duckdb_je_pac_decay_ms_get(pac_t *pac,extent_state_t state)

{
  decay_t *pdVar1;
  
  pdVar1 = &pac->decay_dirty;
  if (state != extent_state_dirty) {
    pdVar1 = &pac->decay_muzzy;
  }
  return (pdVar1->time_ms).repr;
}

Assistant:

static inline void
pac_decay_data_get(pac_t *pac, extent_state_t state,
    decay_t **r_decay, pac_decay_stats_t **r_decay_stats, ecache_t **r_ecache) {
	switch(state) {
	case extent_state_dirty:
		*r_decay = &pac->decay_dirty;
		*r_decay_stats = &pac->stats->decay_dirty;
		*r_ecache = &pac->ecache_dirty;
		return;
	case extent_state_muzzy:
		*r_decay = &pac->decay_muzzy;
		*r_decay_stats = &pac->stats->decay_muzzy;
		*r_ecache = &pac->ecache_muzzy;
		return;
	case extent_state_active:
	case extent_state_retained:
	case extent_state_transition:
	case extent_state_merging:
	default:
		unreachable();
	}
}